

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O0

int ssl_generate_random(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *pmVar1;
  time_t tVar2;
  time_t t;
  uchar *p;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  pmVar1 = ssl->handshake;
  if (((*(uint *)&ssl->conf->field_0x164 >> 1 & 1) == 1) &&
     (ssl->handshake->verify_cookie != (uchar *)0x0)) {
    ssl_local._4_4_ = 0;
  }
  else {
    tVar2 = time((time_t *)0x0);
    pmVar1->randbytes[0] = (uchar)((ulong)tVar2 >> 0x18);
    pmVar1->randbytes[1] = (uchar)((ulong)tVar2 >> 0x10);
    pmVar1->randbytes[2] = (uchar)((ulong)tVar2 >> 8);
    pmVar1->randbytes[3] = (uchar)tVar2;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x260,"client hello, current time: %lu",tVar2);
    ssl_local._4_4_ = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar1->randbytes + 4,0x1c);
    if (ssl_local._4_4_ == 0) {
      ssl_local._4_4_ = 0;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_generate_random( mbedtls_ssl_context *ssl )
{
    int ret;
    unsigned char *p = ssl->handshake->randbytes;
#if defined(MBEDTLS_HAVE_TIME)
    time_t t;
#endif

    /*
     * When responding to a verify request, MUST reuse random (RFC 6347 4.2.1)
     */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake->verify_cookie != NULL )
    {
        return( 0 );
    }
#endif

#if defined(MBEDTLS_HAVE_TIME)
    t = time( NULL );
    *p++ = (unsigned char)( t >> 24 );
    *p++ = (unsigned char)( t >> 16 );
    *p++ = (unsigned char)( t >>  8 );
    *p++ = (unsigned char)( t       );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "client hello, current time: %lu", t ) );
#else
    if( ( ret = ssl->conf->f_rng( ssl->conf->p_rng, p, 4 ) ) != 0 )
        return( ret );

    p += 4;
#endif /* MBEDTLS_HAVE_TIME */

    if( ( ret = ssl->conf->f_rng( ssl->conf->p_rng, p, 28 ) ) != 0 )
        return( ret );

    return( 0 );
}